

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodMakeImmutable
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *field;
  ImmutableFieldLiteGenerator *pIVar2;
  int local_1c;
  int i;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar1 <= local_1c) break;
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,local_1c);
    pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,field);
    (*pIVar2->_vptr_ImmutableFieldLiteGenerator[9])(pIVar2,printer);
    local_1c = local_1c + 1;
  }
  io::Printer::Print(printer,"return null;\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodMakeImmutable(
    io::Printer* printer) {

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateDynamicMethodMakeImmutableCode(printer);
  }

  printer->Print(
    "return null;\n");
}